

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::ShapeSample> * __thiscall
pbrt::Cylinder::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Cylinder *this,Point2f *u)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  Transform *pTVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar15 [64];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  Tuple3<pbrt::Vector3,_float> local_58;
  Point3f local_4c;
  Point3fi local_40;
  undefined1 extraout_var [60];
  
  fVar16 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * this->zMax)),ZEXT416((uint)(1.0 - fVar16)),
                            ZEXT416((uint)this->zMin));
  fVar16 = (u->super_Tuple2<pbrt::Point2,_float>).y * this->phiMax;
  auVar9._0_4_ = this->radius;
  auVar9._4_4_ = this->zMin;
  auVar9._8_4_ = this->zMax;
  auVar9._12_4_ = this->phiMax;
  fVar11 = cosf(fVar16);
  auVar10 = vinsertps_avx(auVar9,ZEXT416((uint)this->radius),0x10);
  auVar15._0_4_ = sinf(fVar16);
  auVar15._4_60_ = extraout_var;
  auVar14._4_4_ = extraout_XMM0_Db;
  auVar14._0_4_ = fVar11;
  auVar14._8_4_ = extraout_XMM0_Dc;
  auVar14._12_4_ = extraout_XMM0_Dd;
  auVar8 = vinsertps_avx(auVar14,auVar15._0_16_,0x10);
  local_78 = auVar10._0_4_;
  fStack_74 = auVar10._4_4_;
  fStack_70 = auVar10._8_4_;
  fStack_6c = auVar10._12_4_;
  auVar12._0_4_ = auVar8._0_4_ * local_78;
  auVar12._4_4_ = auVar8._4_4_ * fStack_74;
  auVar12._8_4_ = auVar8._8_4_ * fStack_70;
  auVar12._12_4_ = auVar8._12_4_ * fStack_6c;
  auVar17._0_4_ = auVar12._0_4_ * auVar12._0_4_;
  auVar17._4_4_ = auVar12._4_4_ * auVar12._4_4_;
  auVar17._8_4_ = auVar12._8_4_ * auVar12._8_4_;
  auVar17._12_4_ = auVar12._12_4_ * auVar12._12_4_;
  auVar10 = vmovshdup_avx(auVar17);
  auVar10 = vfmadd231ss_fma(auVar10,auVar12,auVar12);
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  fVar16 = this->radius / auVar10._0_4_;
  auVar13._0_4_ = auVar12._0_4_ * fVar16;
  auVar13._4_4_ = auVar12._4_4_ * fVar16;
  auVar13._8_4_ = auVar12._8_4_ * fVar16;
  auVar13._12_4_ = auVar12._12_4_ * fVar16;
  local_4c.super_Tuple3<pbrt::Point3,_float>.y = (float)vextractps_avx(auVar13,1);
  auVar10._8_4_ = 0x7fffffff;
  auVar10._0_8_ = 0x7fffffff7fffffff;
  auVar10._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar13,auVar10);
  auVar8._8_4_ = 0x34400002;
  auVar8._0_8_ = 0x3440000234400002;
  auVar8._12_4_ = 0x34400002;
  auVar10 = vmulps_avx512vl(auVar10,auVar8);
  local_58._0_8_ = vmovlps_avx(auVar10);
  local_58.z = 0.0;
  pTVar7 = this->renderFromObject;
  local_4c.super_Tuple3<pbrt::Point3,_float>.x = auVar13._0_4_;
  local_4c.super_Tuple3<pbrt::Point3,_float>.z = auVar21._0_4_;
  Point3fi::Point3fi(&local_40,&local_4c,(Vector3f *)&local_58);
  Transform::operator()((Point3fi *)__return_storage_ptr__,pTVar7,&local_40);
  pTVar7 = this->renderFromObject;
  auVar18._4_4_ = local_4c.super_Tuple3<pbrt::Point3,_float>.x;
  auVar18._0_4_ = local_4c.super_Tuple3<pbrt::Point3,_float>.x;
  auVar18._8_4_ = local_4c.super_Tuple3<pbrt::Point3,_float>.x;
  auVar18._12_4_ = local_4c.super_Tuple3<pbrt::Point3,_float>.x;
  bVar6 = this->reverseOrientation;
  uVar5 = *(undefined8 *)(pTVar7->mInv).m[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(pTVar7->mInv).m[0];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(pTVar7->mInv).m[2];
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_4c.super_Tuple3<pbrt::Point3,_float>.y *
                                          (pTVar7->mInv).m[1][2])),auVar18,
                            ZEXT416((uint)(pTVar7->mInv).m[0][2]));
  auVar21 = vfmadd132ss_fma(ZEXT816(0) << 0x40,auVar10,ZEXT416((uint)(pTVar7->mInv).m[2][2]));
  auVar23._0_4_ = local_4c.super_Tuple3<pbrt::Point3,_float>.y * (float)uVar5;
  auVar23._4_4_ = local_4c.super_Tuple3<pbrt::Point3,_float>.y * (float)((ulong)uVar5 >> 0x20);
  auVar23._8_4_ = local_4c.super_Tuple3<pbrt::Point3,_float>.y * 0.0;
  auVar23._12_4_ = local_4c.super_Tuple3<pbrt::Point3,_float>.y * 0.0;
  auVar14 = ZEXT416(0) << 0x20;
  auVar10 = vfmadd231ps_fma(auVar23,auVar18,auVar22);
  auVar8 = vfmadd231ps_fma(auVar10,auVar14,auVar24);
  fVar11 = auVar21._0_4_;
  auVar19._0_4_ = auVar8._0_4_ * auVar8._0_4_;
  auVar19._4_4_ = auVar8._4_4_ * auVar8._4_4_;
  auVar19._8_4_ = auVar8._8_4_ * auVar8._8_4_;
  auVar19._12_4_ = auVar8._12_4_ * auVar8._12_4_;
  auVar10 = vhaddps_avx(auVar19,auVar19);
  auVar10 = ZEXT416((uint)(auVar10._0_4_ + fVar11 * fVar11));
  auVar10 = vsqrtss_avx(auVar10,auVar10);
  fVar16 = auVar10._0_4_;
  auVar20._4_4_ = fVar16;
  auVar20._0_4_ = fVar16;
  auVar20._8_4_ = fVar16;
  auVar20._12_4_ = fVar16;
  auVar10 = vdivps_avx(auVar8,auVar20);
  auVar21 = auVar10;
  if (bVar6 != false) {
    auVar21._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
    auVar21._8_4_ = auVar10._8_4_ ^ 0x80000000;
    auVar21._12_4_ = auVar10._12_4_ ^ 0x80000000;
  }
  fVar1 = this->zMax;
  fVar2 = this->zMin;
  fVar3 = this->radius;
  fVar4 = this->phiMax;
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar14;
  uVar5 = vmovlps_avx(auVar21);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar5;
  *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       (uint)(bVar6 & 1) * (int)-(fVar11 / fVar16) +
       (uint)!(bool)(bVar6 & 1) * (int)(fVar11 / fVar16);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar14;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
       1.0 / ((fVar1 - fVar2) * fVar3 * fVar4);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const Point2f &u) const {
        Float z = Lerp(u[0], zMin, zMax);
        Float phi = u[1] * phiMax;
        // Compute cylinder sample position _pi_ and normal _n_ from $z$ and $\phi$
        Point3f pObj = Point3f(radius * std::cos(phi), radius * std::sin(phi), z);
        // Reproject _pObj_ to cylinder surface and compute _pObjError_
        Float hitRad = std::sqrt(pObj.x * pObj.x + pObj.y * pObj.y);
        pObj.x *= radius / hitRad;
        pObj.y *= radius / hitRad;
        Vector3f pObjError = gamma(3) * Abs(Vector3f(pObj.x, pObj.y, 0));

        Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
        Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, 0)));
        if (reverseOrientation)
            n *= -1;

        return ShapeSample{Interaction(pi, n), 1 / Area()};
    }